

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMain.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  deUint32 flags;
  char *fileName;
  Platform *platform;
  App *this;
  TestLog log;
  DirArchive archive;
  CommandLine cmdLine;
  TestLog local_b0;
  DirArchive local_a8;
  CommandLine local_80;
  
  setvbuf(_stdout,(char *)0x0,1,0x1000);
  tcu::CommandLine::CommandLine(&local_80,argc,argv);
  tcu::DirArchive::DirArchive(&local_a8,".");
  fileName = tcu::CommandLine::getLogFileName(&local_80);
  flags = tcu::CommandLine::getLogFlags(&local_80);
  tcu::TestLog::TestLog(&local_b0,fileName,flags);
  platform = createPlatform();
  this = (App *)operator_new(0x48);
  tcu::App::App(this,platform,&local_a8.super_Archive,&local_b0,&local_80);
  do {
    bVar1 = tcu::App::iterate(this);
  } while (bVar1);
  (*this->_vptr_App[1])(this);
  (*platform->_vptr_Platform[1])(platform);
  tcu::TestLog::~TestLog(&local_b0);
  tcu::DirArchive::~DirArchive(&local_a8);
  tcu::CommandLine::~CommandLine(&local_80);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
#if (DE_OS != DE_OS_WIN32)
	// Set stdout to line-buffered mode (will be fully buffered by default if stdout is pipe).
	setvbuf(stdout, DE_NULL, _IOLBF, 4*1024);
#endif

	try
	{
		tcu::CommandLine				cmdLine		(argc, argv);
		tcu::DirArchive					archive		(".");
		tcu::TestLog					log			(cmdLine.getLogFileName(), cmdLine.getLogFlags());
		de::UniquePtr<tcu::Platform>	platform	(createPlatform());
		de::UniquePtr<tcu::App>			app			(new tcu::App(*platform, archive, log, cmdLine));

		// Main loop.
		for (;;)
		{
			if (!app->iterate())
				break;
		}
	}
	catch (const std::exception& e)
	{
		tcu::die("%s", e.what());
	}

	return 0;
}